

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

MapcodeError
convertCoordsToMicrosAndFractions
          (Point32 *coord32,int *fracLat,int *fracLon,double latDeg,double lonDeg)

{
  double dVar1;
  double frac;
  double lonDeg_local;
  double latDeg_local;
  int *fracLon_local;
  int *fracLat_local;
  Point32 *coord32_local;
  
  if ((((lonDeg == NAN) || (lonDeg == INFINITY)) || (lonDeg == -INFINITY)) || (latDeg == NAN)) {
    coord32_local._4_4_ = ERR_BAD_COORDINATE;
  }
  else {
    if (-90.0 <= latDeg) {
      lonDeg_local = latDeg;
      if (90.0 < latDeg) {
        lonDeg_local = 90.0;
      }
    }
    else {
      lonDeg_local = -90.0;
    }
    dVar1 = floor((lonDeg_local + 90.0) * 810000000000.0 + 0.1);
    coord32->latMicroDeg = (int)(dVar1 / 810000.0);
    if (fracLat != (int *)0x0) {
      *fracLat = (int)(-(double)coord32->latMicroDeg * 810000.0 + dVar1);
    }
    coord32->latMicroDeg = coord32->latMicroDeg + -90000000;
    dVar1 = floor(lonDeg / 360.0);
    dVar1 = floor((dVar1 * -360.0 + lonDeg) * 3240000000000.0 + 0.1);
    coord32->lonMicroDeg = (int)(dVar1 / 3240000.0);
    if (fracLon != (int *)0x0) {
      *fracLon = (int)(-(double)coord32->lonMicroDeg * 3240000.0 + dVar1);
    }
    if (179999999 < coord32->lonMicroDeg) {
      coord32->lonMicroDeg = coord32->lonMicroDeg + -360000000;
    }
    coord32_local._4_4_ = ERR_OK;
  }
  return coord32_local._4_4_;
}

Assistant:

static enum MapcodeError
convertCoordsToMicrosAndFractions(Point32 *coord32, int *fracLat, int *fracLon, double latDeg, double lonDeg) {
    double frac;
    ASSERT(coord32);
    if (memcmp(&lonDeg, DOUBLE_NAN, 8) == 0 || memcmp(&lonDeg, DOUBLE_INF, 8) == 0 ||
        memcmp(&lonDeg, DOUBLE_MIN_INF, 8) == 0 ||
        memcmp(&latDeg, DOUBLE_NAN, 8) == 0) {
        return ERR_BAD_COORDINATE;
    }
    if (latDeg < -90) {
        latDeg = -90;
    } else if (latDeg > 90) {
        latDeg = 90;
    }
    latDeg += 90; // lat now [0..180]
    ASSERT((0.0 <= latDeg) && (latDeg <= 180.0));
    latDeg *= (double) 810000000000;
    frac = floor(latDeg + 0.1);
    coord32->latMicroDeg = (int) (frac / (double) 810000);
    if (fracLat) {
        frac -= ((double) coord32->latMicroDeg * (double) 810000);
        *fracLat = (int) frac;
    }
    coord32->latMicroDeg -= 90000000;

    lonDeg -= (360.0 * floor(lonDeg / 360)); // lon now in [0..360>
    ASSERT((0.0 <= lonDeg) && (lonDeg < 360.0));
    lonDeg *= (double) 3240000000000;
    frac = floor(lonDeg + 0.1);
    coord32->lonMicroDeg = (int) (frac / (double) 3240000);
    if (fracLon) {
        frac -= (double) coord32->lonMicroDeg * (double) 3240000;
        *fracLon = (int) frac;
    }
    if (coord32->lonMicroDeg >= 180000000) {
        coord32->lonMicroDeg -= 360000000;
    }
    return ERR_OK;
}